

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O0

void __thiscall pg::SPMSolver::pm_stream(SPMSolver *this,ostream *out,int *pm)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  int local_4c;
  int local_3c;
  uint local_28;
  int i;
  bool top_o;
  bool top_e;
  int *pm_local;
  ostream *out_local;
  SPMSolver *this_local;
  
  iVar1 = *pm;
  iVar2 = pm[1];
  std::operator<<(out," {");
  if (iVar1 != -1) {
    poVar3 = std::operator<<(out," ");
    std::ostream::operator<<(poVar3,*pm);
  }
  else {
    std::operator<<(out," \x1b[1;33mTe\x1b[m");
  }
  if (iVar2 != -1) {
    poVar3 = std::operator<<(out," ");
    std::ostream::operator<<(poVar3,pm[1]);
  }
  else {
    std::operator<<(out," \x1b[1;33mTo\x1b[m");
  }
  for (local_28 = 2; (long)(int)local_28 < this->k; local_28 = local_28 + 1) {
    if ((local_28 & 1) == 0) {
      poVar3 = std::operator<<(out," ");
      if (iVar1 != -1) {
        local_4c = pm[(int)local_28];
      }
      else {
        local_4c = 0;
      }
      std::ostream::operator<<(poVar3,local_4c);
    }
    else {
      poVar3 = std::operator<<(out," ");
      if (iVar2 != -1) {
        local_3c = pm[(int)local_28];
      }
      else {
        local_3c = 0;
      }
      std::ostream::operator<<(poVar3,local_3c);
    }
  }
  std::operator<<(out," } ");
  return;
}

Assistant:

void
SPMSolver::pm_stream(std::ostream &out, int *pm)
{
    bool top_e = pm[0] == -1;
    bool top_o = pm[1] == -1;
    out << " {";
    if (top_e) out << " \033[1;33mTe\033[m";
    else out << " " << pm[0];
    if (top_o) out << " \033[1;33mTo\033[m";
    else out << " " << pm[1];
    for (int i=2; i<k; i++) {
        if (i&1) out << " " << (top_o ? 0 : pm[i]);
        else     out << " " << (top_e ? 0 : pm[i]);
    }
    out << " } ";
}